

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* doBuildInputVector(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                    *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *texts)

{
  allocator<float> *this;
  float r_00;
  float g_00;
  byte bVar1;
  initializer_list<float> __l;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  byte *pbVar5;
  reference pvVar6;
  reference pvVar7;
  vector<float,std::allocator<float>> *pvVar8;
  reference pvVar9;
  ulong uVar10;
  char *pcVar11;
  int local_d0;
  float local_cc;
  string local_c8 [8];
  value_type words;
  undefined1 local_a0 [8];
  vector<float,_std::allocator<float>_> HSI;
  undefined1 local_68 [8];
  vector<float,_std::allocator<float>_> rgbn;
  float b;
  float g;
  float r;
  int s;
  int i;
  int local_2c;
  int local_28;
  int t;
  int d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *texts_local;
  vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
  *images_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *input;
  
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__);
  local_28 = 0;
  local_2c = 0;
  while( true ) {
    pvVar2 = std::
             vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
             ::operator[](images,0);
    sVar3 = std::
            vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
            ::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_28) break;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
    for (r = 0.0; sVar3 = std::
                          vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                          ::size(images), (ulong)(long)(int)r < sVar3; r = (float)((int)r + 1)) {
      for (g = 0.0; (int)g < 2; g = (float)((int)g + 1)) {
        pvVar2 = std::
                 vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                 ::operator[](images,(long)(int)r);
        pvVar4 = std::
                 vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                 ::operator[](pvVar2,(long)(local_28 + (int)g));
        pbVar5 = std::array<unsigned_char,_3UL>::operator[](pvVar4,0);
        bVar1 = *pbVar5;
        pvVar2 = std::
                 vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                 ::operator[](images,(long)(int)r);
        pvVar4 = std::
                 vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                 ::operator[](pvVar2,(long)(local_28 + (int)g));
        pbVar5 = std::array<unsigned_char,_3UL>::operator[](pvVar4,1);
        rgbn.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (float)*pbVar5;
        pvVar2 = std::
                 vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                 ::operator[](images,(long)(int)r);
        pvVar4 = std::
                 vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                 ::operator[](pvVar2,(long)(local_28 + (int)g));
        pbVar5 = std::array<unsigned_char,_3UL>::operator[](pvVar4,2);
        rgbn.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = (float)*pbVar5;
        HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (float)bVar1 / 255.0;
        this = (allocator<float> *)
               ((long)&HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3);
        std::allocator<float>::allocator(this);
        __l._M_len = 3;
        __l._M_array = (iterator)
                       ((long)&HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_68,__l,this);
        std::allocator<float>::~allocator
                  ((allocator<float> *)
                   ((long)&HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 3));
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_68,0);
        r_00 = *pvVar6;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_68,1);
        g_00 = *pvVar6;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_68,2);
        RGB2HSI((vector<float,_std::allocator<float>_> *)local_a0,r_00,g_00,*pvVar6);
        pvVar7 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::back(__return_storage_ptr__);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_a0,0);
        words.field_2._8_8_ = (double)*pvVar6 / 6.283185307179586;
        std::vector<float,_std::allocator<float>_>::emplace_back<double>
                  (pvVar7,(double *)((long)&words.field_2 + 8));
        pvVar8 = (vector<float,std::allocator<float>> *)
                 std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::back(__return_storage_ptr__);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_a0,1);
        std::vector<float,std::allocator<float>>::emplace_back<float&>(pvVar8,pvVar6);
        pvVar8 = (vector<float,std::allocator<float>> *)
                 std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::back(__return_storage_ptr__);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_a0,2);
        std::vector<float,std::allocator<float>>::emplace_back<float&>(pvVar8,pvVar6);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_a0);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_68);
      }
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](texts,(long)(int)r);
      std::__cxx11::string::string(local_c8,(string *)pvVar9);
      uVar10 = std::__cxx11::string::size();
      if ((ulong)(long)local_2c < uVar10) {
        pvVar7 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::back(__return_storage_ptr__);
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_c8);
        local_cc = (float)(int)*pcVar11 / 255.0;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(pvVar7,&local_cc);
      }
      else {
        pvVar7 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::back(__return_storage_ptr__);
        local_d0 = 0;
        std::vector<float,_std::allocator<float>_>::emplace_back<int>(pvVar7,&local_d0);
      }
      std::__cxx11::string::~string(local_c8);
    }
    local_28 = local_28 + 2;
    local_2c = local_2c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> doBuildInputVector(std::vector<BMPImage> &images, std::vector<std::string> &texts) {
    std::vector<std::vector<float>> input;
    for (int d = 0,t = 0; d < images[0].size(); d+=2, t++) {
        input.emplace_back();
        for (int i = 0; i < images.size(); i++) {
            for (int s = 0; s < 2; s++) {
                float r = images[i][d+s][0];
                float g = images[i][d+s][1];
                float b = images[i][d+s][2];
                auto rgbn = std::vector<float>({r/255, g/255, b/255});
                auto HSI = RGB2HSI(rgbn[0], rgbn[1], rgbn[2]);
                input.back().emplace_back(HSI[0]/(2*M_PI));
                input.back().emplace_back(HSI[1]);
                input.back().emplace_back(HSI[2]);
            }

            auto words = texts[i];
            if (t < words.size()) input.back().emplace_back(float(words[t])/255);
            else input.back().emplace_back(0);
        }
    }
    return input;
}